

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar4 = mbedtls_mpi_bitlen(X);
  uVar5 = sVar4 + count;
  if ((X->n << 6 < uVar5) &&
     (iVar3 = mbedtls_mpi_grow(X,((uVar5 >> 6) + 1) - (ulong)((uVar5 & 0x3f) == 0)), iVar3 != 0)) {
    return iVar3;
  }
  uVar5 = count >> 6;
  bVar2 = (byte)count & 0x3f;
  if (0x3f < count) {
    for (uVar6 = X->n; uVar5 < uVar6; uVar6 = uVar6 - 1) {
      X->p[uVar6 - 1] = X->p[uVar6 + (-1 - uVar5)];
    }
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      X->p[uVar6] = 0;
    }
  }
  if ((count & 0x3f) != 0) {
    uVar6 = 0;
    for (; uVar5 < X->n; uVar5 = uVar5 + 1) {
      uVar1 = X->p[uVar5];
      X->p[uVar5] = uVar1 << bVar2 | uVar6;
      uVar6 = uVar1 >> (0x40 - bVar2 & 0x3f);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_shift_l( mbedtls_mpi *X, size_t count )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, v0, t1;
    mbedtls_mpi_uint r0 = 0, r1;
    MPI_VALIDATE_RET( X != NULL );

    v0 = count / (biL    );
    t1 = count & (biL - 1);

    i = mbedtls_mpi_bitlen( X ) + count;

    if( X->n * biL < i )
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, BITS_TO_LIMBS( i ) ) );

    ret = 0;

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = X->n; i > v0; i-- )
            X->p[i - 1] = X->p[i - v0 - 1];

        for( ; i > 0; i-- )
            X->p[i - 1] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( t1 > 0 )
    {
        for( i = v0; i < X->n; i++ )
        {
            r1 = X->p[i] >> (biL - t1);
            X->p[i] <<= t1;
            X->p[i] |= r0;
            r0 = r1;
        }
    }

cleanup:

    return( ret );
}